

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Abs_RpmPerformMark(Gia_Man_t *p,int nCutMax,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint nSize0_00;
  uint Res;
  Vec_Int_t *vPis_00;
  Vec_Int_t *vAnds_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  word *pTruth_00;
  char *pcVar5;
  bool bVar6;
  int fChanges;
  int fHasConst;
  int nNodes;
  int nSize0;
  int i;
  int Iter;
  word *pTruth;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSupp2;
  Vec_Int_t *vSupp1;
  Vec_Int_t *vSupp;
  Vec_Int_t *vDoms;
  Vec_Int_t *vAnds;
  Vec_Int_t *vPis;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nCutMax_local;
  Gia_Man_t *p_local;
  
  bVar1 = true;
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark1(p);
  nNodes = 0;
  while( true ) {
    iVar2 = Gia_ManPiNum(p);
    bVar6 = false;
    if (nNodes < iVar2) {
      pTruth = (word *)Gia_ManCi(p,nNodes);
      bVar6 = (Gia_Obj_t *)pTruth != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    *pTruth = *pTruth & 0xbfffffffffffffff | 0x4000000000000000;
    nNodes = nNodes + 1;
  }
  vPis_00 = Vec_IntAlloc(100);
  vAnds_00 = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  nSize0 = 0;
  do {
    if (!bVar1) {
      if (fVeryVerbose != 0) {
        Gia_ManCountPisNodes(p,vPis_00,vAnds_00);
        printf("Iter %3d :  ",(ulong)(uint)nSize0);
        uVar3 = Vec_IntSize(vPis_00);
        iVar2 = Vec_IntSize(vPis_00);
        iVar4 = Gia_ManPiNum(p);
        printf("PI = %5d  (%6.2f %%)  ",((double)iVar2 * 100.0) / (double)iVar4,(ulong)uVar3);
        uVar3 = Vec_IntSize(vAnds_00);
        iVar2 = Vec_IntSize(vAnds_00);
        iVar4 = Gia_ManAndNum(p);
        printf("And = %6d  (%6.2f %%) ",((double)iVar2 * 100.0) / (double)iVar4,(ulong)uVar3);
        printf("\n");
      }
      Vec_IntFree(vPis_00);
      Vec_IntFree(vAnds_00);
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      if (p->pRefs != (int *)0x0) {
        free(p->pRefs);
        p->pRefs = (int *)0x0;
      }
      return;
    }
    bVar1 = false;
    p_02 = Gia_ManComputePiDoms(p);
    if ((fVerbose != 0) || (fVeryVerbose != 0)) {
      Gia_ManCountPisNodes(p,vPis_00,vAnds_00);
      printf("Iter %3d :  ",(ulong)(uint)nSize0);
      uVar3 = Vec_IntSize(vPis_00);
      iVar2 = Vec_IntSize(vPis_00);
      iVar4 = Gia_ManPiNum(p);
      printf("PI = %5d  (%6.2f %%)  ",((double)iVar2 * 100.0) / (double)iVar4,(ulong)uVar3);
      uVar3 = Vec_IntSize(vAnds_00);
      iVar2 = Vec_IntSize(vAnds_00);
      iVar4 = Gia_ManAndNum(p);
      printf("And = %6d  (%6.2f %%) ",((double)iVar2 * 100.0) / (double)iVar4,(ulong)uVar3);
      uVar3 = Vec_IntSize(p_02);
      iVar2 = Vec_IntSize(p_02);
      iVar4 = Gia_ManAndNum(p);
      printf("Dom = %5d  (%6.2f %%)  ",((double)iVar2 * 100.0) / (double)iVar4,(ulong)uVar3);
      printf("\n");
    }
    nNodes = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p_02);
      bVar6 = false;
      if (nNodes < iVar2) {
        iVar2 = Vec_IntEntry(p_02,nNodes);
        pTruth = (word *)Gia_ManObj(p,iVar2);
        bVar6 = (Gia_Obj_t *)pTruth != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      if ((*pTruth >> 0x3e & 1) != 0) {
        __assert_fail("!pObj->fMark1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x2c9,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
      }
      iVar2 = Gia_ObjRefNum(p,(Gia_Obj_t *)pTruth);
      if (iVar2 < 1) {
        __assert_fail("Gia_ObjRefNum( p, pObj ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x2ca,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
      }
      uVar3 = Abs_GiaObjDeref_rec(p,(Gia_Obj_t *)pTruth);
      iVar2 = Abs_ManSupport2(p,(Gia_Obj_t *)pTruth,p_01);
      if (nCutMax < iVar2) {
        Abs_GiaObjRef_rec(p,(Gia_Obj_t *)pTruth);
      }
      else {
        nSize0_00 = Abs_GiaSortNodes(p,p_01);
        if (((int)nSize0_00 < 1) || (nCutMax < (int)nSize0_00)) {
          __assert_fail("nSize0 > 0 && nSize0 <= nCutMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x2eb,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
        }
        pTruth_00 = Gia_ObjComputeTruthTableCut(p,(Gia_Obj_t *)pTruth,p_01);
        if (pTruth_00 == (word *)0x0) {
          Abs_GiaObjRef_rec(p,(Gia_Obj_t *)pTruth);
        }
        else {
          iVar2 = Vec_IntSize(p_01);
          iVar2 = Abs_GiaCheckTruth(pTruth_00,iVar2,nSize0_00);
          Res = (uint)((iVar2 != 0 ^ 0xffU) & 1);
          if (fVeryVerbose != 0) {
            printf("Nodes =%3d ",(ulong)uVar3);
            uVar3 = Vec_IntSize(p_01);
            printf("Size =%3d ",(ulong)uVar3);
            printf("Size0 =%3d  ",(ulong)nSize0_00);
            pcVar5 = "no";
            if (Res != 0) {
              pcVar5 = "yes";
            }
            printf("%3s",pcVar5);
            iVar2 = Vec_IntSize(p_01);
            Abs_GiaCofPrint(pTruth_00,iVar2,nSize0_00,Res);
          }
          if (Res == 0) {
            *pTruth = *pTruth & 0xbfffffffffffffff | 0x4000000000000000;
            bVar1 = true;
          }
          else {
            Abs_GiaObjRef_rec(p,(Gia_Obj_t *)pTruth);
          }
        }
      }
      nNodes = nNodes + 1;
    }
    Vec_IntFree(p_02);
    nSize0 = nSize0 + 1;
  } while( true );
}

Assistant:

void Abs_RpmPerformMark( Gia_Man_t * p, int nCutMax, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vPis, * vAnds, * vDoms;
    Vec_Int_t * vSupp, * vSupp1, * vSupp2;
    Gia_Obj_t * pObj;
    word * pTruth;
    int Iter, i, nSize0, nNodes;
    int fHasConst, fChanges = 1;
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vPis = Vec_IntAlloc( 100 );
    vAnds = Vec_IntAlloc( 100 );
    vSupp1 = Vec_IntAlloc( 100 );
    vSupp2 = Vec_IntAlloc( 100 );
    for ( Iter = 0; fChanges; Iter++ )
    {
        fChanges = 0;
        vDoms = Gia_ManComputePiDoms( p );
        // count the number of PIs and internal nodes
        if ( fVerbose || fVeryVerbose )
        {
            Gia_ManCountPisNodes( p, vPis, vAnds );
            printf( "Iter %3d :  ", Iter );
            printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
            printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
            printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
            printf( "\n" );
        }
//        pObj = Gia_ObjFanin0( Gia_ManPo(p, 1) );
        Gia_ManForEachObjVec( vDoms, p, pObj, i )
        {
            assert( !pObj->fMark1 );
            assert( Gia_ObjRefNum( p, pObj ) > 0 );
            // dereference root node
            nNodes = Abs_GiaObjDeref_rec( p, pObj );
/*
            // compute support of full cone
            if ( Abs_ManSupport1(p, pObj, vSupp1) > nCutMax )
//            if ( 1 )
            {
                // check support of MFFC
                if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
//                if ( 1 )
                {
                    Abs_GiaObjRef_rec( p, pObj );
                    continue;
                }
                vSupp = vSupp2;
//                printf( "-" );
            }
            else
            {
                vSupp = vSupp1;
//                printf( "+" );
            }
*/
            if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            vSupp = vSupp2;

            // order nodes by their ref counts
            nSize0 = Abs_GiaSortNodes( p, vSupp );
            assert( nSize0 > 0 && nSize0 <= nCutMax );
            // check if truth table has const cofs
            pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vSupp );
            if ( pTruth == NULL )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            fHasConst = !Abs_GiaCheckTruth( pTruth, Vec_IntSize(vSupp), nSize0 );
            if ( fVeryVerbose )
            {
                printf( "Nodes =%3d ",  nNodes );
                printf( "Size =%3d ",   Vec_IntSize(vSupp) );
                printf( "Size0 =%3d  ", nSize0 );
                printf( "%3s", fHasConst ? "yes" : "no" );
                Abs_GiaCofPrint( pTruth, Vec_IntSize(vSupp), nSize0, fHasConst );
            }
            if ( fHasConst )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            // pObj can be reparamed
            pObj->fMark1 = 1;
            fChanges = 1;
        }
        Vec_IntFree( vDoms );
    }
    // count the number of PIs and internal nodes
    if ( fVeryVerbose )
    {
        Gia_ManCountPisNodes( p, vPis, vAnds );
        printf( "Iter %3d :  ", Iter );
        printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
        printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
//        printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
        printf( "\n" );
    }
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
//    Gia_ManCleanMark1( p ); // this will erase markings
    ABC_FREE( p->pRefs );
}